

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O0

void Rnm_ManCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vObjs,int nAddOn)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int nAddOn_local;
  Vec_Int_t *vObjs_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCo(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsRo(p,pObj);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                        ,0x15b,"void Rnm_ManCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)"
                       );
        }
      }
      else {
        pGVar2 = Gia_ObjFanin0(pObj);
        Rnm_ManCollect_rec(p,pGVar2,vObjs,nAddOn);
        pGVar2 = Gia_ObjFanin1(pObj);
        Rnm_ManCollect_rec(p,pGVar2,vObjs,nAddOn);
      }
    }
    else {
      pGVar2 = Gia_ObjFanin0(pObj);
      Rnm_ManCollect_rec(p,pGVar2,vObjs,nAddOn);
    }
    iVar1 = Vec_IntSize(vObjs);
    pObj->Value = iVar1 + nAddOn;
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(vObjs,iVar1);
  }
  return;
}

Assistant:

void Rnm_ManCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vObjs, int nAddOn )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCo(pObj) )
        Rnm_ManCollect_rec( p, Gia_ObjFanin0(pObj), vObjs, nAddOn );
    else if ( Gia_ObjIsAnd(pObj) )
    {
        Rnm_ManCollect_rec( p, Gia_ObjFanin0(pObj), vObjs, nAddOn );
        Rnm_ManCollect_rec( p, Gia_ObjFanin1(pObj), vObjs, nAddOn );
    }
    else if ( !Gia_ObjIsRo(p, pObj) )
        assert( 0 );
    pObj->Value = Vec_IntSize(vObjs) + nAddOn;
    Vec_IntPush( vObjs, Gia_ObjId(p, pObj) );
}